

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeAddrMode3Instruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint32_t RegNo_01;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  DecodeStatus DVar9;
  bool bVar10;
  bool bVar11;
  _Bool writeback;
  uint Rt2;
  uint P;
  uint W;
  uint pred;
  uint U;
  uint imm;
  uint type;
  uint Rm;
  uint Rn;
  uint Rt;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  Rn = 3;
  _Rt = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  RegNo = fieldFromInstruction_4(Insn,0xc,4);
  RegNo_00 = fieldFromInstruction_4(Address_local._4_4_,0x10,4);
  RegNo_01 = fieldFromInstruction_4(Address_local._4_4_,0,4);
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,0x16,1);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,8,4);
  uVar4 = fieldFromInstruction_4(Address_local._4_4_,0x17,1);
  W = (~uVar4 & 1) << 8;
  uVar4 = fieldFromInstruction_4(Address_local._4_4_,0x1c,4);
  uVar5 = fieldFromInstruction_4(Address_local._4_4_,0x15,1);
  uVar6 = fieldFromInstruction_4(Address_local._4_4_,0x18,1);
  uVar7 = RegNo + 1;
  bVar10 = uVar5 == 1;
  bVar11 = uVar6 == 0;
  uVar8 = MCInst_getOpcode(pMStack_18);
  if (((uVar8 - 0xa0 < 3) || (uVar8 - 0x1a8 < 3)) && ((RegNo & 1) != 0)) {
    Rn = 1;
  }
  uVar8 = MCInst_getOpcode(pMStack_18);
  if (uVar8 - 0xa0 < 3) {
    if ((uVar2 == 0) || (RegNo_00 != 0xf)) {
      if ((uVar6 == 0) && (uVar5 == 1)) {
        Rn = 1;
      }
      if ((uVar2 == 0) &&
         (((uVar7 == 0xf || (RegNo_01 == 0xf)) || ((RegNo_01 == RegNo || (RegNo_01 == uVar7)))))) {
        Rn = 1;
      }
      if (((uVar2 == 0) && (bVar10 || bVar11)) && (RegNo_00 == 0xf)) {
        Rn = 1;
      }
      if ((bVar10 || bVar11) && ((RegNo_00 == RegNo || (RegNo_00 == uVar7)))) {
        Rn = 1;
      }
    }
    else if (uVar7 == 0xf) {
      Rn = 1;
    }
  }
  else if ((uVar8 == 0xa7) || (uVar8 - 0xaa < 2)) {
    if ((uVar2 == 0) || (RegNo_00 != 0xf)) {
      if (RegNo == 0xf) {
        Rn = 1;
      }
      if ((uVar2 == 0) && (RegNo_01 == 0xf)) {
        Rn = 1;
      }
      if (((uVar2 == 0) && (bVar10 || bVar11)) && ((RegNo_00 == 0xf || (RegNo_00 == RegNo)))) {
        Rn = 1;
      }
    }
    else if (RegNo == 0xf) {
      Rn = 1;
    }
  }
  else if (((uVar8 == 0xaf) || (uVar8 - 0xb2 < 3)) || (uVar8 - 0xb7 < 2)) {
    if ((uVar2 == 0) || (RegNo_00 != 0xf)) {
      if ((uVar2 != 0) && ((RegNo == 0xf || ((bVar10 || bVar11 && (RegNo_00 == RegNo)))))) {
        Rn = 1;
      }
      if ((uVar2 == 0) && ((RegNo == 0xf || (RegNo_01 == 0xf)))) {
        Rn = 1;
      }
      if (((uVar2 == 0) && (bVar10 || bVar11)) && ((RegNo_00 == 0xf || (RegNo_00 == RegNo)))) {
        Rn = 1;
      }
    }
    else if (RegNo == 0xf) {
      Rn = 1;
    }
  }
  else if (uVar8 - 0x1a8 < 3) {
    if ((uVar6 == 0) && (uVar5 == 1)) {
      Rn = 1;
    }
    if ((bVar10 || bVar11) && (((RegNo_00 == 0xf || (RegNo_00 == RegNo)) || (RegNo_00 == uVar7)))) {
      Rn = 1;
    }
    if ((uVar2 != 0) && (RegNo_01 == 0xf)) {
      Rn = 1;
    }
    if (uVar7 == 0xf) {
      Rn = 1;
    }
    if ((uVar2 == 0) && (uVar5 = fieldFromInstruction_4(Address_local._4_4_,8,4), uVar5 != 0)) {
      Rn = 1;
    }
  }
  else if ((uVar8 == 0x1af) || (uVar8 - 0x1b2 < 2)) {
    if (RegNo == 0xf) {
      Rn = 1;
    }
    if ((bVar10 || bVar11) && ((RegNo_00 == 0xf || (RegNo_00 == RegNo)))) {
      Rn = 1;
    }
    if ((uVar2 == 0) && (RegNo_01 == 0xf)) {
      Rn = 1;
    }
  }
  if (bVar10 || bVar11) {
    pMStack_18->writeback = true;
    if (uVar6 == 0) {
      W = W | 0x400;
    }
    else {
      W = W | 0x200;
    }
    uVar8 = MCInst_getOpcode(pMStack_18);
    if (((uVar8 - 0x1a8 < 3) || (uVar8 == 0x1af)) || (uVar8 == 0x1b2 || uVar8 == 0x1b3)) {
      DVar9 = DecodeGPRRegisterClass(pMStack_18,RegNo_00,(uint64_t)Decoder_local,_Rt);
      _Var1 = Check(&Rn,DVar9);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
  }
  DVar9 = DecodeGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rt);
  _Var1 = Check(&Rn,DVar9);
  if (_Var1) {
    uVar8 = MCInst_getOpcode(pMStack_18);
    if ((uVar8 - 0xa0 < 3) || (uVar8 - 0x1a8 < 3)) {
      DVar9 = DecodeGPRRegisterClass(pMStack_18,RegNo + 1,(uint64_t)Decoder_local,_Rt);
      _Var1 = Check(&Rn,DVar9);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    if ((bVar10 || bVar11) &&
       (((uVar8 = MCInst_getOpcode(pMStack_18), uVar8 - 0xa0 < 3 || (uVar8 == 0xa7)) ||
        ((uVar8 - 0xa9 < 3 ||
         (((uVar8 == 0xaf || (uVar8 - 0xb1 < 4)) || (uVar8 == 0xb7 || uVar8 == 0xb8)))))))) {
      DVar9 = DecodeGPRRegisterClass(pMStack_18,RegNo_00,(uint64_t)Decoder_local,_Rt);
      _Var1 = Check(&Rn,DVar9);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    DVar9 = DecodeGPRRegisterClass(pMStack_18,RegNo_00,(uint64_t)Decoder_local,_Rt);
    _Var1 = Check(&Rn,DVar9);
    if (_Var1) {
      if (uVar2 == 0) {
        DVar9 = DecodeGPRRegisterClass(pMStack_18,RegNo_01,(uint64_t)Decoder_local,_Rt);
        _Var1 = Check(&Rn,DVar9);
        if (!_Var1) {
          return MCDisassembler_Fail;
        }
        MCOperand_CreateImm0(pMStack_18,(ulong)W);
      }
      else {
        MCOperand_CreateReg0(pMStack_18,0);
        MCOperand_CreateImm0(pMStack_18,(ulong)(W | uVar3 << 4 | RegNo_01));
      }
      DVar9 = DecodePredicateOperand(pMStack_18,uVar4,(uint64_t)Decoder_local,_Rt);
      _Var1 = Check(&Rn,DVar9);
      if (_Var1) {
        Inst_local._4_4_ = Rn;
      }
      else {
        Inst_local._4_4_ = MCDisassembler_Fail;
      }
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeAddrMode3Instruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned type = fieldFromInstruction_4(Insn, 22, 1);
	unsigned imm = fieldFromInstruction_4(Insn, 8, 4);
	unsigned U = ((~fieldFromInstruction_4(Insn, 23, 1)) & 1) << 8;
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned W = fieldFromInstruction_4(Insn, 21, 1);
	unsigned P = fieldFromInstruction_4(Insn, 24, 1);
	unsigned Rt2 = Rt + 1;

	bool writeback = (W == 1) | (P == 0);

	// For {LD,ST}RD, Rt must be even, else undefined.
	switch (MCInst_getOpcode(Inst)) {
		case ARM_STRD:
		case ARM_STRD_PRE:
		case ARM_STRD_POST:
		case ARM_LDRD:
		case ARM_LDRD_PRE:
		case ARM_LDRD_POST:
			if (Rt & 0x1) S = MCDisassembler_SoftFail;
			break;
		default:
			break;
	}
	switch (MCInst_getOpcode(Inst)) {
		case ARM_STRD:
		case ARM_STRD_PRE:
		case ARM_STRD_POST:
			if (P == 0 && W == 1)
				S = MCDisassembler_SoftFail;

			if (writeback && (Rn == 15 || Rn == Rt || Rn == Rt2))
				S = MCDisassembler_SoftFail;
			if (type && Rm == 15)
				S = MCDisassembler_SoftFail;
			if (Rt2 == 15)
				S = MCDisassembler_SoftFail;
			if (!type && fieldFromInstruction_4(Insn, 8, 4))
				S = MCDisassembler_SoftFail;
			break;
		case ARM_STRH:
		case ARM_STRH_PRE:
		case ARM_STRH_POST:
			if (Rt == 15)
				S = MCDisassembler_SoftFail;
			if (writeback && (Rn == 15 || Rn == Rt))
				S = MCDisassembler_SoftFail;
			if (!type && Rm == 15)
				S = MCDisassembler_SoftFail;
			break;
		case ARM_LDRD:
		case ARM_LDRD_PRE:
		case ARM_LDRD_POST:
			if (type && Rn == 15){
				if (Rt2 == 15)
					S = MCDisassembler_SoftFail;
				break;
			}
			if (P == 0 && W == 1)
				S = MCDisassembler_SoftFail;
			if (!type && (Rt2 == 15 || Rm == 15 || Rm == Rt || Rm == Rt2))
				S = MCDisassembler_SoftFail;
			if (!type && writeback && Rn == 15)
				S = MCDisassembler_SoftFail;
			if (writeback && (Rn == Rt || Rn == Rt2))
				S = MCDisassembler_SoftFail;
			break;
		case ARM_LDRH:
		case ARM_LDRH_PRE:
		case ARM_LDRH_POST:
			if (type && Rn == 15){
				if (Rt == 15)
					S = MCDisassembler_SoftFail;
				break;
			}
			if (Rt == 15)
				S = MCDisassembler_SoftFail;
			if (!type && Rm == 15)
				S = MCDisassembler_SoftFail;
			if (!type && writeback && (Rn == 15 || Rn == Rt))
				S = MCDisassembler_SoftFail;
			break;
		case ARM_LDRSH:
		case ARM_LDRSH_PRE:
		case ARM_LDRSH_POST:
		case ARM_LDRSB:
		case ARM_LDRSB_PRE:
		case ARM_LDRSB_POST:
			if (type && Rn == 15){
				if (Rt == 15)
					S = MCDisassembler_SoftFail;
				break;
			}
			if (type && (Rt == 15 || (writeback && Rn == Rt)))
				S = MCDisassembler_SoftFail;
			if (!type && (Rt == 15 || Rm == 15))
				S = MCDisassembler_SoftFail;
			if (!type && writeback && (Rn == 15 || Rn == Rt))
				S = MCDisassembler_SoftFail;
			break;
		default:
			break;
	}

	if (writeback) { // Writeback
		Inst->writeback = true;
		if (P)
			U |= ARMII_IndexModePre << 9;
		else
			U |= ARMII_IndexModePost << 9;

		// On stores, the writeback operand precedes Rt.
		switch (MCInst_getOpcode(Inst)) {
			case ARM_STRD:
			case ARM_STRD_PRE:
			case ARM_STRD_POST:
			case ARM_STRH:
			case ARM_STRH_PRE:
			case ARM_STRH_POST:
				if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
					return MCDisassembler_Fail;
				break;
			default:
				break;
		}
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	switch (MCInst_getOpcode(Inst)) {
		case ARM_STRD:
		case ARM_STRD_PRE:
		case ARM_STRD_POST:
		case ARM_LDRD:
		case ARM_LDRD_PRE:
		case ARM_LDRD_POST:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt+1, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	if (writeback) {
		// On loads, the writeback operand comes after Rt.
		switch (MCInst_getOpcode(Inst)) {
			case ARM_LDRD:
			case ARM_LDRD_PRE:
			case ARM_LDRD_POST:
			case ARM_LDRH:
			case ARM_LDRH_PRE:
			case ARM_LDRH_POST:
			case ARM_LDRSH:
			case ARM_LDRSH_PRE:
			case ARM_LDRSH_POST:
			case ARM_LDRSB:
			case ARM_LDRSB_PRE:
			case ARM_LDRSB_POST:
			case ARM_LDRHTr:
			case ARM_LDRSBTr:
				if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
					return MCDisassembler_Fail;
				break;
			default:
				break;
		}
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	if (type) {
		MCOperand_CreateReg0(Inst, 0);
		MCOperand_CreateImm0(Inst, U | (imm << 4) | Rm);
	} else {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
		MCOperand_CreateImm0(Inst, U);
	}

	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}